

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _utils.c
# Opt level: O1

bm_results_t * bm_init_results(void)

{
  bm_results_t *in_RDI;
  
  in_RDI->run10 = 0;
  in_RDI->run100 = 0;
  in_RDI->run1000 = 0;
  in_RDI->run10000 = 0;
  in_RDI->iter10000 = 0;
  in_RDI->run1 = 0;
  in_RDI->run10 = 0;
  in_RDI->iter100 = 0;
  in_RDI->iter1000 = 0;
  in_RDI->iter1 = 0;
  in_RDI->iter10 = 0;
  return in_RDI;
}

Assistant:

bm_results_t bm_init_results(void) {
    bm_results_t res;
    res.iter1 = 0;
    res.iter10 = 0;
    res.iter100 = 0;
    res.iter1000 = 0;
    res.iter10000 = 0;
    res.run1 = 0;
    res.run10 = 0;
    res.run100 = 0;
    res.run1000 = 0;
    res.run10000 = 0;
    return res;
}